

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O2

shared_ptr<helics::Broker>
helics::BrokerFactory::create(CoreType type,string_view brokerName,string_view configureString)

{
  element_type *peVar1;
  bool bVar2;
  RegistrationFailure *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *pcVar3;
  CoreType type_00;
  undefined4 in_register_0000003c;
  shared_ptr<helics::Broker> *broker;
  char *in_R9;
  string_view name;
  string_view message;
  shared_ptr<helics::Broker> sVar4;
  size_t sStack_c0;
  allocator<char> local_b5;
  CoreType newType;
  string_view configureString_local;
  string newName;
  string local_80;
  undefined1 local_60 [40];
  string *local_38;
  CoreType *local_30;
  
  broker = (shared_ptr<helics::Broker> *)CONCAT44(in_register_0000003c,type);
  configureString_local._M_len = (size_t)configureString._M_str;
  pcVar3 = brokerName._M_str;
  type_00 = (CoreType)brokerName._M_len;
  newName._M_dataplus._M_p = (pointer)&newName.field_2;
  newName._M_string_length = 0;
  newName.field_2._M_local_buf[0] = '\0';
  configureString_local._M_str = in_R9;
  if (pcVar3 == (char *)0x0 || type_00 == EXTRACT) {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_80,
               (basic_string_view<char,_std::char_traits<char>_> *)&configureString_local,&local_b5)
    ;
    helics::core::extractCoreType
              ((pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_60,&local_80);
    local_38 = &newName;
    local_30 = &newType;
    std::tuple<helics::CoreType&,std::__cxx11::string&>::operator=
              ((tuple<helics::CoreType&,std::__cxx11::string&> *)&local_38,
               (pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_60);
    std::__cxx11::string::~string((string *)(local_60 + 8));
    std::__cxx11::string::~string((string *)&local_80);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)newName._M_string_length;
    }
    if (type_00 == EXTRACT) {
      type_00 = newType;
    }
  }
  name._M_len = (ulong)type_00;
  name._M_str = pcVar3;
  makeBroker(type,name);
  peVar1 = (broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    this = (RegistrationFailure *)__cxa_allocate_exception(0x28);
    pcVar3 = "unable to create broker";
    sStack_c0 = 0x17;
  }
  else {
    (*peVar1->_vptr_Broker[8])(peVar1,configureString_local._M_len,configureString_local._M_str);
    bVar2 = registerBroker(broker,type_00);
    if (bVar2) {
      (*((broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        _vptr_Broker[2])();
      std::__cxx11::string::~string((string *)&newName);
      sVar4.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar4.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)broker;
      return (shared_ptr<helics::Broker>)
             sVar4.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
    }
    this = (RegistrationFailure *)__cxa_allocate_exception(0x28);
    pcVar3 = "unable to register broker";
    sStack_c0 = 0x19;
  }
  message._M_str = pcVar3;
  message._M_len = sStack_c0;
  RegistrationFailure::RegistrationFailure(this,message);
  __cxa_throw(this,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
}

Assistant:

std::shared_ptr<Broker>
    create(CoreType type, std::string_view brokerName, std::string_view configureString)
{
    std::string newName;
    CoreType newType;
    if (type == CoreType::EXTRACT || brokerName.empty()) {
        std::tie(newType, newName) = core::extractCoreType(std::string{configureString});
        if (brokerName.empty() && !newName.empty()) {
            brokerName = newName;
        }
        if (type == CoreType::EXTRACT) {
            type = newType;
        }
    }
    auto broker = makeBroker(type, brokerName);
    if (!broker) {
        throw(helics::RegistrationFailure("unable to create broker"));
    }
    broker->configure(configureString);
    if (!registerBroker(broker, type)) {
        throw(helics::RegistrationFailure("unable to register broker"));
    }
    broker->connect();
    return broker;
}